

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

int __thiscall tetgenmesh::checkshells(tetgenmesh *this)

{
  int iVar1;
  int iVar2;
  memorypool *pmVar3;
  void **ppvVar4;
  long lVar5;
  void **ppvVar6;
  void *pvVar7;
  void *pvVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  char *__s;
  uint uVar14;
  uint uVar15;
  void *pvVar16;
  void *pvVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  void *pvVar21;
  uint uVar22;
  ulong uVar23;
  
  if (this->b->quiet == 0) {
    puts("  Checking consistency of the mesh boundary...");
  }
  pmVar3 = this->subfaces;
  ppvVar6 = pmVar3->pathblock;
  pvVar7 = pmVar3->pathitem;
  iVar1 = pmVar3->pathitemsleft;
  iVar2 = pmVar3->alignbytes;
  ppvVar4 = pmVar3->firstblock;
  pmVar3->pathblock = ppvVar4;
  pmVar3->pathitem =
       (void *)((long)ppvVar4 + (((long)iVar2 + 8U) - (ulong)(ppvVar4 + 1) % (ulong)(long)iVar2));
  pmVar3->pathitemsleft = pmVar3->itemsperblock;
  do {
    pvVar8 = memorypool::traverse(pmVar3);
    if (pvVar8 == (void *)0x0) {
LAB_0014f308:
      iVar19 = 0;
      if (this->b->quiet == 0) {
        puts("  Mesh boundaries connected correctly.");
      }
LAB_0014f329:
      pmVar3 = this->subfaces;
      pmVar3->pathblock = ppvVar6;
      pmVar3->pathitem = pvVar7;
      pmVar3->pathitemsleft = iVar1;
      pmVar3->alignbytes = iVar2;
      return iVar19;
    }
  } while (*(long *)((long)pvVar8 + 0x18) == 0);
  iVar19 = 0;
  do {
    iVar9 = 0;
    uVar14 = 0;
    iVar20 = iVar19;
    do {
      lVar13 = *(long *)((long)pvVar8 + (long)sorgpivot[(int)uVar14] * 8);
      lVar5 = *(long *)((long)pvVar8 + (long)sdestpivot[(int)uVar14] * 8);
      uVar11 = *(ulong *)((long)pvVar8 + (long)((int)uVar14 >> 1) * 8);
      pvVar16 = (void *)(uVar11 & 0xfffffffffffffff8);
      pvVar21 = pvVar8;
      uVar22 = uVar14;
      iVar19 = iVar20;
      if (pvVar8 != pvVar16 && pvVar16 != (void *)0x0) {
        while (pvVar17 = pvVar16, *(long *)((long)pvVar17 + 0x18) != 0) {
          uVar15 = (uint)uVar11;
          uVar18 = uVar15 & 7;
          lVar12 = *(long *)((long)pvVar17 + (long)sorgpivot[uVar18] * 8);
          if (((lVar12 != lVar13) ||
              (*(long *)((long)pvVar17 + (long)sdestpivot[uVar18] * 8) != lVar5)) &&
             ((lVar12 != lVar5 ||
              (*(long *)((long)pvVar17 + (long)sdestpivot[uVar18] * 8) != lVar13)))) {
            __s = "  !! !! Wrong subface-subface connection.";
LAB_0014ea23:
            puts(__s);
            lVar12 = (long)this->pointmarkindex;
            printf("    First: x%lx (%d, %d, %d).\n",pvVar21,
                   (ulong)*(uint *)(*(long *)((long)pvVar21 + (long)sorgpivot[(int)uVar22] * 8) +
                                   lVar12 * 4),
                   (ulong)*(uint *)(*(long *)((long)pvVar21 + (long)sdestpivot[(int)uVar22] * 8) +
                                   lVar12 * 4),
                   (ulong)*(uint *)(*(long *)((long)pvVar21 + (long)sapexpivot[(int)uVar22] * 8) +
                                   lVar12 * 4));
            uVar11 = (ulong)(uVar18 << 2);
            lVar12 = (long)this->pointmarkindex;
            printf("    Scond: x%lx (%d, %d, %d).\n",pvVar17,
                   (ulong)*(uint *)(*(long *)((long)pvVar17 +
                                             (long)*(int *)((long)sorgpivot + uVar11) * 8) +
                                   lVar12 * 4),
                   (ulong)*(uint *)(*(long *)((long)pvVar17 +
                                             (long)*(int *)((long)sdestpivot + uVar11) * 8) +
                                   lVar12 * 4),
                   (ulong)*(uint *)(*(long *)((long)pvVar17 +
                                             (long)*(int *)((long)sapexpivot + uVar11) * 8) +
                                   lVar12 * 4));
            goto LAB_0014eaf4;
          }
          if (*(long *)((long)pvVar17 + (long)sapexpivot[uVar18] * 8) ==
              *(long *)((long)pvVar21 + (long)sapexpivot[(int)uVar22] * 8)) {
            __s = "  !! !! Existing two duplicated subfaces.";
            goto LAB_0014ea23;
          }
          uVar22 = uVar15 & 7;
          uVar11 = *(ulong *)((long)pvVar17 + (ulong)(uVar15 & 6) * 4);
          pvVar16 = (void *)(uVar11 & 0xfffffffffffffff8);
          if ((pvVar16 == (void *)0x0) || (pvVar21 = pvVar17, pvVar8 == pvVar16)) goto LAB_0014eb15;
        }
        puts("  !! !! Wrong subface-subface connection (Dead subface).");
        lVar12 = (long)this->pointmarkindex;
        printf("    First: x%lx (%d, %d, %d).\n",pvVar21,
               (ulong)*(uint *)(*(long *)((long)pvVar21 + (long)sorgpivot[(int)uVar22] * 8) +
                               lVar12 * 4),
               (ulong)*(uint *)(*(long *)((long)pvVar21 + (long)sdestpivot[(int)uVar22] * 8) +
                               lVar12 * 4),
               (ulong)*(uint *)(*(long *)((long)pvVar21 + (long)sapexpivot[(int)uVar22] * 8) +
                               lVar12 * 4));
        printf("    Second: x%lx (DEAD)\n",pvVar17);
LAB_0014eaf4:
        iVar19 = iVar20 + 1;
      }
LAB_0014eb15:
      uVar11 = *(ulong *)((long)pvVar8 + (long)((int)uVar14 >> 1) * 8 + 0x30);
      uVar10 = uVar11 & 0xfffffffffffffff8;
      if (uVar10 != 0) {
        if (*(long *)(uVar10 + 0x18) == 0) {
          puts("  !! !! Wrong subface-subseg connection (Dead subseg).");
          lVar13 = (long)this->pointmarkindex;
          printf("    Sub: x%lx (%d, %d, %d).\n",pvVar8,
                 (ulong)*(uint *)(*(long *)((long)pvVar8 + (long)sorgpivot[(int)uVar14] * 8) +
                                 lVar13 * 4),
                 (ulong)*(uint *)(*(long *)((long)pvVar8 + (long)sdestpivot[(int)uVar14] * 8) +
                                 lVar13 * 4),
                 (ulong)*(uint *)(*(long *)((long)pvVar8 + (long)sapexpivot[(int)uVar14] * 8) +
                                 lVar13 * 4));
          printf("    Sub: x%lx (Dead)\n",uVar10);
        }
        else {
          uVar15 = (uint)uVar11 & 7;
          lVar12 = *(long *)(uVar10 + (long)sorgpivot[uVar15] * 8);
          if (((lVar12 == lVar13) && (*(long *)(uVar10 + (long)sdestpivot[uVar15] * 8) == lVar5)) ||
             ((lVar12 == lVar5 && (*(long *)(uVar10 + (long)sdestpivot[uVar15] * 8) == lVar13))))
          goto LAB_0014ecd7;
          puts("  !! !! Wrong subface-subseg connection.");
          lVar13 = (long)this->pointmarkindex;
          printf("    Sub: x%lx (%d, %d, %d).\n",pvVar8,
                 (ulong)*(uint *)(*(long *)((long)pvVar8 + (long)sorgpivot[(int)uVar14] * 8) +
                                 lVar13 * 4),
                 (ulong)*(uint *)(*(long *)((long)pvVar8 + (long)sdestpivot[(int)uVar14] * 8) +
                                 lVar13 * 4),
                 (ulong)*(uint *)(*(long *)((long)pvVar8 + (long)sapexpivot[(int)uVar14] * 8) +
                                 lVar13 * 4));
          printf("    Seg: x%lx (%d, %d).\n",uVar10,
                 (ulong)*(uint *)(*(long *)(uVar10 + (long)*(int *)((long)sorgpivot +
                                                                   (ulong)(uVar15 << 2)) * 8) +
                                 (long)this->pointmarkindex * 4),
                 (ulong)*(uint *)(*(long *)(uVar10 + (long)*(int *)((long)sdestpivot +
                                                                   (ulong)(uVar15 << 2)) * 8) +
                                 (long)this->pointmarkindex * 4));
        }
        iVar19 = iVar19 + 1;
      }
LAB_0014ecd7:
      if (iVar20 < iVar19) break;
      uVar14 = snextpivot[(int)uVar14];
      iVar9 = iVar9 + 1;
      iVar20 = iVar19;
    } while (iVar9 != 3);
    uVar11 = *(ulong *)((long)pvVar8 + (ulong)(uVar14 & 1) * 8 + 0x48);
    uVar10 = uVar11 & 0xfffffffffffffff0;
    if (uVar10 != 0) {
      if (*(long *)(uVar10 + 0x20) == 0) {
        puts("  !! !! Wrong sub-to-tet connection (Dead tet)");
        lVar13 = (long)this->pointmarkindex;
        printf("    Sub: x%lx (%d, %d, %d).\n",pvVar8,
               (ulong)*(uint *)(*(long *)((long)pvVar8 + (long)sorgpivot[(int)uVar14] * 8) +
                               lVar13 * 4),
               (ulong)*(uint *)(*(long *)((long)pvVar8 + (long)sdestpivot[(int)uVar14] * 8) +
                               lVar13 * 4),
               (ulong)*(uint *)(*(long *)((long)pvVar8 + (long)sapexpivot[(int)uVar14] * 8) +
                               lVar13 * 4));
        printf("    Tet: x%lx (DEAD)\n",uVar10);
        iVar19 = iVar19 + 1;
      }
      else {
        uVar15 = stpivottbl[(uint)uVar11 & 0xf][(int)uVar14];
        if ((*(long *)((long)pvVar8 + (long)sorgpivot[(int)uVar14] * 8) !=
             *(long *)(uVar10 + (long)orgpivot[(int)uVar15] * 8)) ||
           (*(long *)((long)pvVar8 + (long)sdestpivot[(int)uVar14] * 8) !=
            *(long *)(uVar10 + (long)destpivot[(int)uVar15] * 8))) {
          puts("  !! !! Wrong sub-to-tet connection");
          lVar13 = (long)this->pointmarkindex;
          printf("    Sub: x%lx (%d, %d, %d).\n",pvVar8,
                 (ulong)*(uint *)(*(long *)((long)pvVar8 + (long)sorgpivot[(int)uVar14] * 8) +
                                 lVar13 * 4),
                 (ulong)*(uint *)(*(long *)((long)pvVar8 + (long)sdestpivot[(int)uVar14] * 8) +
                                 lVar13 * 4),
                 (ulong)*(uint *)(*(long *)((long)pvVar8 + (long)sapexpivot[(int)uVar14] * 8) +
                                 lVar13 * 4));
          lVar13 = (long)this->pointmarkindex;
          printf("    Tet: x%lx (%d, %d, %d, %d).\n",uVar10,
                 (ulong)*(uint *)(*(long *)(uVar10 + (long)orgpivot[(int)uVar15] * 8) + lVar13 * 4),
                 (ulong)*(uint *)(*(long *)(uVar10 + (long)destpivot[(int)uVar15] * 8) + lVar13 * 4)
                 ,(ulong)*(uint *)(*(long *)(uVar10 + (long)apexpivot[(int)uVar15] * 8) + lVar13 * 4
                                  ),
                 (ulong)*(uint *)(*(long *)(uVar10 + (long)oppopivot[(int)uVar15] * 8) + lVar13 * 4)
                );
          iVar19 = iVar19 + 1;
        }
        if (*(long *)(uVar10 + 0x48) == 0) {
          uVar11 = 0;
        }
        else {
          uVar23 = *(ulong *)(*(long *)(uVar10 + 0x48) + (ulong)(uVar15 & 3) * 8);
          uVar11 = uVar23 & 0xfffffffffffffff8;
          uVar22 = tspivottbl[(int)uVar15][(uint)uVar23 & 7];
        }
        if ((*(long *)(uVar11 + (long)sorgpivot[(int)uVar22] * 8) !=
             *(long *)(uVar10 + (long)orgpivot[(int)uVar15] * 8)) ||
           (*(long *)(uVar11 + (long)sdestpivot[(int)uVar22] * 8) !=
            *(long *)(uVar10 + (long)destpivot[(int)uVar15] * 8))) {
          puts("  !! !! Wrong tet-sub connection.");
          lVar13 = (long)this->pointmarkindex;
          printf("    Sub: x%lx (%d, %d, %d).\n",uVar11,
                 (ulong)*(uint *)(*(long *)(uVar11 + (long)sorgpivot[(int)uVar22] * 8) + lVar13 * 4)
                 ,(ulong)*(uint *)(*(long *)(uVar11 + (long)sdestpivot[(int)uVar22] * 8) +
                                  lVar13 * 4),
                 (ulong)*(uint *)(*(long *)(uVar11 + (long)sapexpivot[(int)uVar22] * 8) + lVar13 * 4
                                 ));
          lVar13 = (long)this->pointmarkindex;
          printf("    Tet: x%lx (%d, %d, %d, %d).\n",uVar10,
                 (ulong)*(uint *)(*(long *)(uVar10 + (long)orgpivot[(int)uVar15] * 8) + lVar13 * 4),
                 (ulong)*(uint *)(*(long *)(uVar10 + (long)destpivot[(int)uVar15] * 8) + lVar13 * 4)
                 ,(ulong)*(uint *)(*(long *)(uVar10 + (long)apexpivot[(int)uVar15] * 8) + lVar13 * 4
                                  ),
                 (ulong)*(uint *)(*(long *)(uVar10 + (long)oppopivot[(int)uVar15] * 8) + lVar13 * 4)
                );
          iVar19 = iVar19 + 1;
        }
        uVar11 = *(ulong *)(uVar10 + (ulong)(uVar15 & 3) * 8);
        uVar10 = uVar11 & 0xfffffffffffffff0;
        if (*(long *)(uVar10 + 0x48) != 0) {
          uVar22 = fsymtbl[(int)uVar15][(uint)uVar11 & 0xf];
          uVar11 = *(ulong *)(*(long *)(uVar10 + 0x48) + (ulong)(uVar22 & 3) * 8);
          uVar23 = uVar11 & 0xfffffffffffffff8;
          if (uVar23 != 0) {
            iVar20 = tspivottbl[(int)uVar22][(uint)uVar11 & 7];
            if ((*(long *)(uVar23 + (long)sorgpivot[iVar20] * 8) !=
                 *(long *)(uVar10 + (long)orgpivot[(int)uVar22] * 8)) ||
               (*(long *)(uVar23 + (long)sdestpivot[iVar20] * 8) !=
                *(long *)(uVar10 + (long)destpivot[(int)uVar22] * 8))) {
              puts("  !! !! Wrong tet-sub connection.");
              lVar13 = (long)this->pointmarkindex;
              printf("    Sub: x%lx (%d, %d, %d).\n",uVar23,
                     (ulong)*(uint *)(*(long *)(uVar23 + (long)sorgpivot[iVar20] * 8) + lVar13 * 4),
                     (ulong)*(uint *)(*(long *)(uVar23 + (long)sdestpivot[iVar20] * 8) + lVar13 * 4)
                     ,(ulong)*(uint *)(*(long *)(uVar23 + (long)sapexpivot[iVar20] * 8) + lVar13 * 4
                                      ));
              lVar13 = (long)this->pointmarkindex;
              printf("    Tet: x%lx (%d, %d, %d, %d).\n",uVar10,
                     (ulong)*(uint *)(*(long *)(uVar10 + (long)orgpivot[(int)uVar22] * 8) +
                                     lVar13 * 4),
                     (ulong)*(uint *)(*(long *)(uVar10 + (long)destpivot[(int)uVar22] * 8) +
                                     lVar13 * 4),
                     (ulong)*(uint *)(*(long *)(uVar10 + (long)apexpivot[(int)uVar22] * 8) +
                                     lVar13 * 4));
              iVar19 = iVar19 + 1;
            }
            goto LAB_0014f1f6;
          }
        }
        puts("  Warning: Broken tet-sub-tet connection.");
      }
    }
LAB_0014f1f6:
    uVar22 = *(uint *)((long)pvVar8 + (long)this->shmarkindex * 4 + 4);
    if ((uVar22 & 1) != 0) {
      printf("  !! A infected subface: (%d, %d, %d).\n",
             (ulong)*(uint *)(*(long *)((long)pvVar8 + (long)sorgpivot[(int)uVar14] * 8) +
                             (long)this->pointmarkindex * 4),
             (ulong)*(uint *)(*(long *)((long)pvVar8 + (long)sdestpivot[(int)uVar14] * 8) +
                             (long)this->pointmarkindex * 4));
      uVar22 = *(uint *)((long)pvVar8 + (long)this->shmarkindex * 4 + 4);
    }
    if ((uVar22 & 2) != 0) {
      printf("  !! A marked subface: (%d, %d, %d).\n",
             (ulong)*(uint *)(*(long *)((long)pvVar8 + (long)sorgpivot[(int)uVar14] * 8) +
                             (long)this->pointmarkindex * 4),
             (ulong)*(uint *)(*(long *)((long)pvVar8 + (long)sdestpivot[(int)uVar14] * 8) +
                             (long)this->pointmarkindex * 4));
    }
    pmVar3 = this->subfaces;
    do {
      pvVar8 = memorypool::traverse(pmVar3);
      if (pvVar8 == (void *)0x0) {
        if (iVar19 == 0) goto LAB_0014f308;
        printf("  !! !! !! !! %d boundary connection viewed with horror.\n");
        goto LAB_0014f329;
      }
    } while (*(long *)((long)pvVar8 + 0x18) == 0);
  } while( true );
}

Assistant:

int tetgenmesh::checkshells()
{
  triface neightet, symtet;
  face shloop, spinsh, nextsh;
  face checkseg;
  point pa, pb;
  int bakcount;
  int horrors, i;

  if (!b->quiet) {
    printf("  Checking consistency of the mesh boundary...\n");
  }
  horrors = 0;

  void **bakpathblock = subfaces->pathblock;
  void *bakpathitem = subfaces->pathitem;
  int bakpathitemsleft = subfaces->pathitemsleft;
  int bakalignbytes = subfaces->alignbytes;

  subfaces->traversalinit();
  shloop.sh = shellfacetraverse(subfaces);
  while (shloop.sh != NULL) {
    shloop.shver = 0;
    for (i = 0; i < 3; i++) {
      // Check the face ring at this edge.
      pa = sorg(shloop);
      pb = sdest(shloop);
      spinsh = shloop;
      spivot(spinsh, nextsh);
      bakcount = horrors;
      while ((nextsh.sh != NULL) && (nextsh.sh != shloop.sh)) {
        if (nextsh.sh[3] == NULL) {
          printf("  !! !! Wrong subface-subface connection (Dead subface).\n");
          printf("    First: x%lx (%d, %d, %d).\n", (uintptr_t) spinsh.sh,
                 pointmark(sorg(spinsh)), pointmark(sdest(spinsh)), 
                 pointmark(sapex(spinsh)));
          printf("    Second: x%lx (DEAD)\n", (uintptr_t) nextsh.sh);
          horrors++;
          break;
        }
        // check if they have the same edge.
        if (!(((sorg(nextsh) == pa) && (sdest(nextsh) == pb)) ||
              ((sorg(nextsh) == pb) && (sdest(nextsh) == pa)))) {
           printf("  !! !! Wrong subface-subface connection.\n");
           printf("    First: x%lx (%d, %d, %d).\n", (uintptr_t) spinsh.sh,
                  pointmark(sorg(spinsh)), pointmark(sdest(spinsh)), 
                  pointmark(sapex(spinsh)));
           printf("    Scond: x%lx (%d, %d, %d).\n", (uintptr_t) nextsh.sh,
                  pointmark(sorg(nextsh)), pointmark(sdest(nextsh)), 
                  pointmark(sapex(nextsh)));
           horrors++;
           break;
        }
        // Check they should not have the same apex.
        if (sapex(nextsh) == sapex(spinsh)) {
           printf("  !! !! Existing two duplicated subfaces.\n");
           printf("    First: x%lx (%d, %d, %d).\n", (uintptr_t) spinsh.sh,
                  pointmark(sorg(spinsh)), pointmark(sdest(spinsh)), 
                  pointmark(sapex(spinsh)));
           printf("    Scond: x%lx (%d, %d, %d).\n", (uintptr_t) nextsh.sh,
                  pointmark(sorg(nextsh)), pointmark(sdest(nextsh)), 
                  pointmark(sapex(nextsh)));
           horrors++;
           break;
        }
        spinsh = nextsh;
        spivot(spinsh, nextsh);
      }
      // Check subface-subseg bond.
      sspivot(shloop, checkseg);
      if (checkseg.sh != NULL) {
        if (checkseg.sh[3] == NULL) {
          printf("  !! !! Wrong subface-subseg connection (Dead subseg).\n");
          printf("    Sub: x%lx (%d, %d, %d).\n", (uintptr_t) shloop.sh,
                 pointmark(sorg(shloop)), pointmark(sdest(shloop)), 
                 pointmark(sapex(shloop)));
          printf("    Sub: x%lx (Dead)\n", (uintptr_t) checkseg.sh);
          horrors++;
        } else {
          if (!(((sorg(checkseg) == pa) && (sdest(checkseg) == pb)) ||
                ((sorg(checkseg) == pb) && (sdest(checkseg) == pa)))) {
            printf("  !! !! Wrong subface-subseg connection.\n");
            printf("    Sub: x%lx (%d, %d, %d).\n", (uintptr_t) shloop.sh,
                   pointmark(sorg(shloop)), pointmark(sdest(shloop)), 
                   pointmark(sapex(shloop)));
            printf("    Seg: x%lx (%d, %d).\n", (uintptr_t) checkseg.sh,
                   pointmark(sorg(checkseg)), pointmark(sdest(checkseg)));
            horrors++;
          }
        }
      }
      if (horrors > bakcount) break; // An error detected. 
      senextself(shloop);
    }
    // Check tet-subface connection.
    stpivot(shloop, neightet);
    if (neightet.tet != NULL) {
      if (neightet.tet[4] == NULL) {
        printf("  !! !! Wrong sub-to-tet connection (Dead tet)\n");
        printf("    Sub: x%lx (%d, %d, %d).\n", (uintptr_t) shloop.sh,
               pointmark(sorg(shloop)), pointmark(sdest(shloop)), 
               pointmark(sapex(shloop)));
        printf("    Tet: x%lx (DEAD)\n", (uintptr_t) neightet.tet);
        horrors++;
      } else {
        if (!((sorg(shloop) == org(neightet)) && 
              (sdest(shloop) == dest(neightet)))) {
          printf("  !! !! Wrong sub-to-tet connection\n");
          printf("    Sub: x%lx (%d, %d, %d).\n", (uintptr_t) shloop.sh,
                 pointmark(sorg(shloop)), pointmark(sdest(shloop)), 
                 pointmark(sapex(shloop)));
          printf("    Tet: x%lx (%d, %d, %d, %d).\n",
                 (uintptr_t) neightet.tet, pointmark(org(neightet)), 
                 pointmark(dest(neightet)), pointmark(apex(neightet)),
                 pointmark(oppo(neightet)));
          horrors++;
        }
        tspivot(neightet, spinsh);
        if (!((sorg(spinsh) == org(neightet)) && 
              (sdest(spinsh) == dest(neightet)))) {
          printf("  !! !! Wrong tet-sub connection.\n");
          printf("    Sub: x%lx (%d, %d, %d).\n", (uintptr_t) spinsh.sh,
                 pointmark(sorg(spinsh)), pointmark(sdest(spinsh)), 
                 pointmark(sapex(spinsh)));
          printf("    Tet: x%lx (%d, %d, %d, %d).\n", 
                 (uintptr_t) neightet.tet, pointmark(org(neightet)), 
                 pointmark(dest(neightet)), pointmark(apex(neightet)), 
                 pointmark(oppo(neightet)));
          horrors++;
        }
        fsym(neightet, symtet);
        tspivot(symtet, spinsh);
        if (spinsh.sh != NULL) {
          if (!((sorg(spinsh) == org(symtet)) && 
                (sdest(spinsh) == dest(symtet)))) {
            printf("  !! !! Wrong tet-sub connection.\n");
            printf("    Sub: x%lx (%d, %d, %d).\n", (uintptr_t) spinsh.sh,
                   pointmark(sorg(spinsh)), pointmark(sdest(spinsh)), 
                   pointmark(sapex(spinsh)));
            printf("    Tet: x%lx (%d, %d, %d, %d).\n", 
                   (uintptr_t) symtet.tet, pointmark(org(symtet)), 
                   pointmark(dest(symtet)), pointmark(apex(symtet)), 
                   pointmark(oppo(symtet)));
            horrors++;
          }
        } else {
          printf("  Warning: Broken tet-sub-tet connection.\n");
        }
      }
    }
    if (sinfected(shloop)) {
      // This may be a bug. report it.
      printf("  !! A infected subface: (%d, %d, %d).\n", 
             pointmark(sorg(shloop)), pointmark(sdest(shloop)), 
             pointmark(sapex(shloop)));
    }
    if (smarktested(shloop)) {
      // This may be a bug. report it.
      printf("  !! A marked subface: (%d, %d, %d).\n", pointmark(sorg(shloop)), 
             pointmark(sdest(shloop)), pointmark(sapex(shloop)));
    }
    shloop.sh = shellfacetraverse(subfaces);
  }

  if (horrors == 0) {
    if (!b->quiet) {
      printf("  Mesh boundaries connected correctly.\n");
    }
  } else {
    printf("  !! !! !! !! %d boundary connection viewed with horror.\n",
           horrors);
  }

  subfaces->pathblock = bakpathblock;
  subfaces->pathitem = bakpathitem;
  subfaces->pathitemsleft = bakpathitemsleft;
  subfaces->alignbytes = bakalignbytes;

  return horrors;
}